

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpikingPopulation.h
# Opt level: O1

void __thiscall
SpikingPopulation::SpikingPopulation(SpikingPopulation *this,int amount,string *type)

{
  pointer pcVar1;
  string local_40;
  
  pcVar1 = (type->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + type->_M_string_length);
  Population::Population(&this->super_Population,amount,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_Population)._vptr_Population = (_func_int **)&PTR_update_00110ce8;
  return;
}

Assistant:

SpikingPopulation(int amount, std::string type) : Population(amount, type) { }